

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O2

int __thiscall TadsServerManager::rand(TadsServerManager *this)

{
  uint32_t uVar1;
  isaacctx *piVar2;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->mutex->h);
  piVar2 = this->ic;
  uVar1 = piVar2->cnt;
  piVar2->cnt = piVar2->cnt - 1;
  piVar2 = this->ic;
  if (uVar1 == 0) {
    isaac_gen_group(piVar2);
    this->ic->cnt = 0xff;
    piVar2 = this->ic;
  }
  uVar1 = piVar2->rsl[piVar2->cnt];
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex->h);
  return uVar1;
}

Assistant:

ulong TadsServerManager::rand()
{
    /* ISAAC needs protection against multi-threaded access */
    mutex->lock();

    /* get a random number */
    ulong r = isaac_rand(ic);

    /* done with the mutex */
    mutex->unlock();

    /* return the number */
    return r;
}